

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall
nnad::Matrix<double>::Matrix(Matrix<double> *this,int *Lines,int *Columns,int *RandomSeed)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  double dVar4;
  allocator_type local_21;
  
  iVar2 = *Lines;
  this->_Lines = iVar2;
  iVar1 = *Columns;
  this->_Columns = iVar1;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->_Matrix,(long)(iVar1 * iVar2),&local_21);
  srand(*RandomSeed);
  for (lVar3 = 0; lVar3 < (long)this->_Columns * (long)this->_Lines; lVar3 = lVar3 + 1) {
    do {
      iVar2 = rand();
      dVar4 = (double)(iVar2 % 100) * 0.02 + -1.0;
    } while (dVar4 == 0.0);
    (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar3] = dVar4;
  }
  return;
}

Assistant:

Matrix(int const& Lines, int const& Columns, int const& RandomSeed = -1):
      _Lines(Lines),
      _Columns(Columns),
      _Matrix(_Lines * _Columns)
    {
      // Initialise random number generator.
      srand(RandomSeed);

      // Fill in the matrix with random numbers distributed in [-1:1]
      for (int i = 0; i < _Lines * _Columns; i++)
        {
          double temp = 2e-2 * ( rand() % 100 ) - 1;
          while(!temp)
            temp = 2e-2 * ( rand() % 100 ) - 1;

          _Matrix[i] = T(temp);
        }
    }